

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg3s.cc
# Opt level: O1

void __thiscall trng::mrg3s::seed(mrg3s *this,unsigned_long s)

{
  int iVar1;
  int iVar2;
  int64_t t;
  
  iVar1 = (int)((long)s % 0x7fffadb3);
  iVar2 = iVar1 + 0x7fffadb3;
  if (-1 < (long)s % 0x7fffadb3) {
    iVar2 = iVar1;
  }
  (this->S).r[0] = iVar2;
  (this->S).r[1] = 1;
  (this->S).r[2] = 1;
  return;
}

Assistant:

void mrg3s::seed(unsigned long s) {
    int64_t t(s);
    t %= modulus;
    if (t < 0)
      t += modulus;
    S.r[0] = static_cast<result_type>(t);
    S.r[1] = 1;
    S.r[2] = 1;
  }